

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_user(connectdata *conn)

{
  char *pcVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pcVar1 = *(char **)((long)(conn->data->req).protop + 8);
  pcVar3 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar3 = pcVar1;
  }
  CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"USER %s",pcVar3);
  if (CVar2 == CURLE_OK) {
    (conn->proto).ftpc.state = FTP_USER;
    (conn->data->state).ftp_trying_alternative = false;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_user(struct connectdata *conn)
{
  CURLcode result;
  struct FTP *ftp = conn->data->req.protop;
  /* send USER */
  PPSENDF(&conn->proto.ftpc.pp, "USER %s", ftp->user?ftp->user:"");

  state(conn, FTP_USER);
  conn->data->state.ftp_trying_alternative = FALSE;

  return CURLE_OK;
}